

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
          (cmExportFileGenerator *this,cmGeneratorTarget *target,PreprocessContext preprocessRule,
          ImportPropertyMap *properties)

{
  string *prop;
  bool bVar1;
  int iVar2;
  cmValue input;
  mapped_type *pmVar3;
  long lVar4;
  string prepro;
  allocator<char> local_66;
  allocator<char> local_65;
  PreprocessContext local_64;
  ImportPropertyMap *local_60;
  cmExportFileGenerator *local_58;
  string local_50;
  
  local_64 = preprocessRule;
  local_60 = properties;
  local_58 = this;
  bVar1 = cmGeneratorTarget::IsLinkable(target);
  if (bVar1) {
    if (PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
        ::linkIfaceProps_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                                   ::linkIfaceProps_abi_cxx11_);
      if (iVar2 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                    ::linkIfaceProps_abi_cxx11_,"INTERFACE_LINK_LIBRARIES",
                   (allocator<char> *)&local_50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                    ::linkIfaceProps_abi_cxx11_._M_elems + 1),"INTERFACE_LINK_LIBRARIES_DIRECT",
                   &local_65);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                    ::linkIfaceProps_abi_cxx11_._M_elems + 2),
                   "INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE",&local_66);
        __cxa_atexit(std::
                     array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                     ::~array,&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                               ::linkIfaceProps_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                             ::linkIfaceProps_abi_cxx11_);
      }
    }
    bVar1 = false;
    for (lVar4 = 0; lVar4 != 0x60; lVar4 = lVar4 + 0x20) {
      prop = (string *)
             ((long)&PopulateInterfaceLinkLibrariesProperty(cmGeneratorTarget_const*,cmGeneratorExpression::PreprocessContext,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                     ::linkIfaceProps_abi_cxx11_._M_elems[0]._M_dataplus._M_p + lVar4);
      input = cmGeneratorTarget::GetProperty(target,prop);
      if (input.Value != (string *)0x0) {
        cmGeneratorExpression::Preprocess(&local_50,input.Value,local_64,false);
        if (local_50._M_string_length != 0) {
          ResolveTargetsInGeneratorExpressions(local_58,&local_50,target,ReplaceFreeTargets);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](local_60,prop);
          bVar1 = true;
          std::__cxx11::string::_M_assign((string *)pmVar3);
        }
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty(
  cmGeneratorTarget const* target,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties)
{
  if (!target->IsLinkable()) {
    return false;
  }
  static const std::array<std::string, 3> linkIfaceProps = {
    { "INTERFACE_LINK_LIBRARIES", "INTERFACE_LINK_LIBRARIES_DIRECT",
      "INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE" }
  };
  bool hadINTERFACE_LINK_LIBRARIES = false;
  for (std::string const& linkIfaceProp : linkIfaceProps) {
    if (cmValue input = target->GetProperty(linkIfaceProp)) {
      std::string prepro =
        cmGeneratorExpression::Preprocess(*input, preprocessRule);
      if (!prepro.empty()) {
        this->ResolveTargetsInGeneratorExpressions(prepro, target,
                                                   ReplaceFreeTargets);
        properties[linkIfaceProp] = prepro;
        hadINTERFACE_LINK_LIBRARIES = true;
      }
    }
  }
  return hadINTERFACE_LINK_LIBRARIES;
}